

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

CodeLocationRange *
soul::SourceCodeUtilities::findRangeOfASTObject
          (CodeLocationRange *__return_storage_ptr__,ASTObject *object)

{
  SourceCodeText *o;
  FindLexicalRangeVisitor v;
  undefined **local_40;
  SourceCodeText *local_38;
  char *pcStack_30;
  SourceCodeText *local_28;
  char *pcStack_20;
  
  local_40 = &PTR__FindLexicalRangeVisitor_00300e18;
  local_38 = (SourceCodeText *)0x0;
  pcStack_30 = (char *)0x0;
  pcStack_20 = (char *)0x0;
  local_28 = (object->context).location.sourceCode.object;
  if (local_28 != (SourceCodeText *)0x0) {
    (local_28->super_RefCountedObject).refCount = (local_28->super_RefCountedObject).refCount + 1;
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
  o = local_38;
  pcStack_20 = (object->context).location.location.data;
  if (local_28 != (SourceCodeText *)0x0) {
    (local_28->super_RefCountedObject).refCount = (local_28->super_RefCountedObject).refCount + 1;
  }
  local_38 = local_28;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  pcStack_30 = pcStack_20;
  findRangeOfASTObject(soul::AST::ASTObject&)::FindLexicalRangeVisitor::visitObject(soul::AST::
  ASTObject__(&local_40,object);
  (__return_storage_ptr__->start).sourceCode.object = local_38;
  if (local_38 != (SourceCodeText *)0x0) {
    (local_38->super_RefCountedObject).refCount = (local_38->super_RefCountedObject).refCount + 1;
  }
  (__return_storage_ptr__->start).location.data = pcStack_30;
  (__return_storage_ptr__->end).sourceCode.object = local_28;
  if (local_28 != (SourceCodeText *)0x0) {
    (local_28->super_RefCountedObject).refCount = (local_28->super_RefCountedObject).refCount + 1;
  }
  (__return_storage_ptr__->end).location.data = pcStack_20;
  local_40 = &PTR__FindLexicalRangeVisitor_00300e18;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_38);
  return __return_storage_ptr__;
}

Assistant:

CodeLocationRange SourceCodeUtilities::findRangeOfASTObject (AST::ASTObject& object)
{
    struct FindLexicalRangeVisitor  : public ASTVisitor
    {
        void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto loc = o.context.location;

            if (loc.location < range.start.location)  range.start = loc;
            if (loc.location > range.end.location)    range.end = loc;
        }

        CodeLocationRange range;
    };

    FindLexicalRangeVisitor v;
    v.range.start = v.range.end = object.context.location;
    v.visitObject (object);
    return v.range;
}